

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_misc.cpp
# Opt level: O0

int M_ReadFile(char *name,BYTE **buffer)

{
  int __fd;
  int iVar1;
  BYTE *__buf;
  ssize_t sVar2;
  BYTE *buf;
  stat fileinfo;
  int length;
  int count;
  int handle;
  BYTE **buffer_local;
  char *name_local;
  
  __fd = open(name,0,0x1b6);
  if (__fd == -1) {
    I_Error("Couldn\'t read file %s",name);
  }
  iVar1 = stat(name,(stat *)&buf);
  if (iVar1 == -1) {
    I_Error("Couldn\'t read file %s",name);
  }
  fileinfo.__glibc_reserved[2]._4_4_ = (int)fileinfo.st_rdev;
  __buf = (BYTE *)operator_new__((long)(int)fileinfo.st_rdev);
  sVar2 = read(__fd,__buf,(long)fileinfo.__glibc_reserved[2]._4_4_);
  close(__fd);
  if ((int)sVar2 < fileinfo.__glibc_reserved[2]._4_4_) {
    I_Error("Couldn\'t read file %s",name);
  }
  *buffer = __buf;
  return fileinfo.__glibc_reserved[2]._4_4_;
}

Assistant:

int M_ReadFile (char const *name, BYTE **buffer)
{
	int handle, count, length;
	struct stat fileinfo;
	BYTE *buf;

	handle = open (name, O_RDONLY | O_BINARY, 0666);
	if (handle == -1)
		I_Error ("Couldn't read file %s", name);
	// [BL] Use stat instead of fstat for v140_xp hack
	if (stat (name,&fileinfo) == -1)
		I_Error ("Couldn't read file %s", name);
	length = fileinfo.st_size;
	buf = new BYTE[length];
	count = read (handle, buf, length);
	close (handle);

	if (count < length)
		I_Error ("Couldn't read file %s", name);

	*buffer = buf;
	return length;
}